

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  iterator iVar1;
  undefined4 uVar2;
  shaderexecutor *psVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pSVar4;
  const_iterator cVar5;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *pvVar6;
  long lVar7;
  undefined4 in_register_00000084;
  ulong uVar8;
  long lVar9;
  long lVar10;
  In3 in3;
  In2 in2;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  tuple;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  fixedInputs;
  In1 in1;
  In0 in0;
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Random rnd;
  Void local_152;
  Void local_151;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_150;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_148;
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_140;
  undefined4 local_134;
  undefined1 local_130 [12];
  Vector<float,_2> local_124;
  Void local_11c;
  Void local_11b [3];
  void *local_118;
  void *pvStack_110;
  long local_108;
  void *pvStack_100;
  void *local_f8;
  long lStack_f0;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  void *pvStack_d0;
  void *local_c8;
  long lStack_c0;
  long local_b0;
  value_type local_a8;
  value_type local_9c;
  shaderexecutor *local_90;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *local_88;
  ulong local_80;
  ulong local_78;
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  local_70;
  deRandom local_40;
  
  local_b0 = CONCAT44(in_register_00000084,intPrecision);
  local_134 = SUB84(floatFormat,0);
  deRandom_init(&local_40,(deUint32)numSamples);
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = (void *)0x0;
  lStack_c0 = 0;
  local_d8 = 0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (void *)0x0;
  pvStack_e0 = (void *)0x0;
  local_f8 = (void *)0x0;
  lStack_f0 = 0;
  local_108 = 0;
  pvStack_100 = (void *)0x0;
  local_118 = (void *)0x0;
  pvStack_110 = (void *)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_100);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_e8);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_d0);
  local_90 = this;
  local_88 = samplings;
  if (pvStack_110 != local_118) {
    local_140 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_148 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    lVar10 = 0;
    uVar8 = 0;
    do {
      local_80 = uVar8;
      if (local_f8 != pvStack_100) {
        lVar9 = 0;
        uVar8 = 0;
        do {
          local_78 = uVar8;
          if (pvStack_e0 != local_e8) {
            pvVar6 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                     0x0;
            do {
              local_150 = pvVar6;
              if (local_c8 != pvStack_d0) {
                uVar8 = 0;
                do {
                  lVar7 = 0;
                  do {
                    *(undefined4 *)(local_130 + lVar7 * 4) =
                         *(undefined4 *)((long)local_118 + lVar7 * 4 + lVar10);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 3);
                  lVar7 = 0;
                  do {
                    *(undefined4 *)(local_11b + lVar7 * 4 + -9) =
                         *(undefined4 *)((long)pvStack_100 + lVar7 * 4 + lVar9);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 == 1);
                  std::
                  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                  ::
                  _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                            ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                              *)&local_70,
                             (InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                              *)local_130);
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  push_back(&__return_storage_ptr__->in0,(value_type *)local_130);
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back(&__return_storage_ptr__->in1,(value_type *)(local_130 + 0xc));
                  iVar1._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>
                              (local_140,iVar1,(Void *)(local_130 + 0x14));
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_148,iVar1,local_11b)
                    ;
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (ulong)((long)local_c8 - (long)pvStack_d0));
              }
              pvVar6 = local_150 + 1;
            } while (pvVar6 < (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                               *)((long)pvStack_e0 - (long)local_e8));
          }
          uVar8 = local_78 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar8 < (ulong)((long)local_f8 - (long)pvStack_100 >> 3));
      }
      uVar8 = local_80 + 1;
      lVar10 = lVar10 + 0xc;
    } while (uVar8 < (ulong)(((long)pvStack_110 - (long)local_118 >> 2) * -0x5555555555555555));
  }
  pSVar4 = local_88;
  psVar3 = local_90;
  uVar2 = local_134;
  if (local_b0 != 0) {
    local_140 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in1;
    local_148 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in2;
    local_150 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    do {
      (**(code **)(**(long **)psVar3 + 8))(&local_9c,*(long **)psVar3,pSVar4,uVar2,&local_40);
      (**(code **)(**(long **)(psVar3 + 8) + 8))
                (&local_a8,*(long **)(psVar3 + 8),pSVar4,uVar2,&local_40);
      (**(code **)(**(long **)(psVar3 + 0x10) + 8))
                (*(long **)(psVar3 + 0x10),pSVar4,uVar2,&local_40);
      (**(code **)(**(long **)(psVar3 + 0x18) + 8))
                (*(long **)(psVar3 + 0x18),pSVar4,uVar2,&local_40);
      local_130._8_4_ = local_9c.m_data[2];
      local_130._0_4_ = local_9c.m_data[0];
      local_130._4_4_ = local_9c.m_data[1];
      local_124.m_data[0] = local_a8.m_data[0];
      local_124.m_data[1] = local_a8.m_data[1];
      cVar5 = std::
              _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
              ::find(&local_70,(key_type *)local_130);
      if ((_Rb_tree_header *)cVar5._M_node == &local_70._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
        ::
        _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>const&>
                  ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>>>
                    *)&local_70,(key_type *)local_130);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_9c);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   local_140,&local_a8);
        iVar1._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_148,iVar1,&local_151);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_150,iVar1,&local_152);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      local_b0 = local_b0 + -1;
    } while (local_b0 != 0);
  }
  std::
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>_>
  ::~_Rb_tree(&local_70);
  if (pvStack_d0 != (void *)0x0) {
    operator_delete(pvStack_d0,lStack_c0 - (long)pvStack_d0);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if (pvStack_100 != (void *)0x0) {
    operator_delete(pvStack_100,lStack_f0 - (long)pvStack_100);
  }
  if (local_118 != (void *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}